

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

bool compareActualValue(DataType datatype,XSValue_Data actValue,XSValue_Data expValue)

{
  undefined1 uVar1;
  
  uVar1 = (*(code *)(&DAT_0013c0d4 + *(int *)(&DAT_0013c0d4 + (ulong)datatype * 4)))();
  return (bool)uVar1;
}

Assistant:

static bool compareActualValue( const XSValue::DataType             datatype
                              , const XSValue::XSValue_Data         actValue
                              , const XSValue::XSValue_Data         expValue)
{
    switch (datatype) {
        case XSValue::dt_boolean:
            if (actValue.fValue.f_bool == expValue.fValue.f_bool)
                return true;
            printf("ACTVALUE_TEST Unexpected XSValue for dt_boolean, got %d expected %d\n",
                    actValue.fValue.f_bool, expValue.fValue.f_bool);
            return false;

        case XSValue::dt_decimal:
            if (fabs(actValue.fValue.f_double - expValue.fValue.f_double) < fabs(actValue.fValue.f_double)/1000)
                return true;
            printf("ACTVALUE_TEST Unexpected XSValue for datatype %s, got %f expected %f\n", StrX(getDataTypeString(datatype)).localForm(),
                actValue.fValue.f_double, expValue.fValue.f_double);
            return false;
        case XSValue::dt_double:
            if (actValue.fValue.f_doubleType.f_doubleEnum == XSValue::DoubleFloatType_Normal) {
                if (fabs(actValue.fValue.f_double - expValue.fValue.f_double) < fabs(actValue.fValue.f_double)/1000)
                    return true;
                printf("ACTVALUE_TEST Unexpected XSValue for datatype %s, got %f expected %f\n", StrX(getDataTypeString(datatype)).localForm(),
                        actValue.fValue.f_double, expValue.fValue.f_double);
                return false;
            }
            else {
                if (actValue.fValue.f_doubleType.f_doubleEnum == expValue.fValue.f_doubleType.f_doubleEnum)
                    return true;
                printf("ACTVALUE_TEST Unexpected XSValue enum for datatype %s, got %d expected %d\n", StrX(getDataTypeString(datatype)).localForm(),
                        actValue.fValue.f_doubleType.f_doubleEnum, expValue.fValue.f_doubleType.f_doubleEnum);
                return false;
            }
        case XSValue::dt_float:
            if (actValue.fValue.f_floatType.f_floatEnum == XSValue::DoubleFloatType_Normal) {
                if (fabs(actValue.fValue.f_float - expValue.fValue.f_float) < fabs(actValue.fValue.f_float)/1000)
                    return true;
                printf("ACTVALUE_TEST Unexpected XSValue for datatype %s, got %f expected %f\n", StrX(getDataTypeString(datatype)).localForm(),
                        actValue.fValue.f_float, expValue.fValue.f_float);
                return false;
            }
            else {
                if (actValue.fValue.f_floatType.f_floatEnum == expValue.fValue.f_floatType.f_floatEnum)
                    return true;
                printf("ACTVALUE_TEST Unexpected XSValue enum for datatype %s, got %d expected %d\n", StrX(getDataTypeString(datatype)).localForm(),
                        actValue.fValue.f_floatType.f_floatEnum, expValue.fValue.f_floatType.f_floatEnum);
                return false;
            }
        case XSValue::dt_duration:
        case XSValue::dt_dateTime:
        case XSValue::dt_time:
        case XSValue::dt_date:
        case XSValue::dt_gYearMonth:
        case XSValue::dt_gYear:
        case XSValue::dt_gMonthDay:
        case XSValue::dt_gDay:
        case XSValue::dt_gMonth:
            if (actValue.fValue.f_datetime.f_year   == expValue.fValue.f_datetime.f_year   &&
                actValue.fValue.f_datetime.f_month  == expValue.fValue.f_datetime.f_month  &&
                actValue.fValue.f_datetime.f_day    == expValue.fValue.f_datetime.f_day    &&
                actValue.fValue.f_datetime.f_hour   == expValue.fValue.f_datetime.f_hour   &&
                actValue.fValue.f_datetime.f_min    == expValue.fValue.f_datetime.f_min    &&
                actValue.fValue.f_datetime.f_second == expValue.fValue.f_datetime.f_second &&
                (fabs(actValue.fValue.f_datetime.f_milisec  - expValue.fValue.f_datetime.f_milisec) < 0.01))
                return true;
            printf("ACTVALUE_TEST Unexpected %s XSValue\n", StrX(getDataTypeString(datatype)).localForm());
            printf(" Actual year = %d, month = %d, day = %d, hour = %d, min = %d, second = %d, milisec = %f\n",
                actValue.fValue.f_datetime.f_year, actValue.fValue.f_datetime.f_month, actValue.fValue.f_datetime.f_day,
                actValue.fValue.f_datetime.f_hour, actValue.fValue.f_datetime.f_min, actValue.fValue.f_datetime.f_second, actValue.fValue.f_datetime.f_milisec);
            printf(" Expect year = %d, month = %d, day = %d, hour = %d, min = %d, second = %d, milisec = %f\n",
                expValue.fValue.f_datetime.f_year, expValue.fValue.f_datetime.f_month, expValue.fValue.f_datetime.f_day,
                expValue.fValue.f_datetime.f_hour, expValue.fValue.f_datetime.f_min, expValue.fValue.f_datetime.f_second, expValue.fValue.f_datetime.f_milisec);
            return false;

        case XSValue::dt_hexBinary:
            // in the tests in this file the hexBinary data is always 2 long...
            if (actValue.fValue.f_byteVal[0] == expValue.fValue.f_byteVal[0] &&
                actValue.fValue.f_byteVal[1] == expValue.fValue.f_byteVal[1])
                return true;
            printf("ACTVALUE_TEST Unexpected hexBinary value\n");
            printf(" Actual Value = %x:%x\n",actValue.fValue.f_byteVal[0],actValue.fValue.f_byteVal[1]);
            printf(" Expect Value = %x:%x\n",expValue.fValue.f_byteVal[0],expValue.fValue.f_byteVal[1]);
            return false;

        case XSValue::dt_base64Binary:
            // in the tests in this file the base64Binary data is always 9 long (XMLByte[9])
            // however, a zero byte is used to indicate when the smaller data stream is empty
            {
                for (unsigned int i=0; i<9; i++)
                {
                    if (!expValue.fValue.f_byteVal[i])
                        return true;
                    if (actValue.fValue.f_byteVal[i] != expValue.fValue.f_byteVal[i])
                    {
                        printf("ACTVALUE_TEST Unexpected base64Binary value for byte %d\n", i);
                        printf(" Actual Value = %x\n",actValue.fValue.f_byteVal[i]);
                        printf(" Expect Value = %x\n",expValue.fValue.f_byteVal[i]);
                        return false;
                    }
                }
                return true;
            }

        case XSValue::dt_string:
        case XSValue::dt_anyURI:
        case XSValue::dt_QName:
        case XSValue::dt_NOTATION:
        case XSValue::dt_normalizedString:
        case XSValue::dt_token:
        case XSValue::dt_language:
        case XSValue::dt_NMTOKEN:
        case XSValue::dt_NMTOKENS:
        case XSValue::dt_Name:
        case XSValue::dt_NCName:
        case XSValue::dt_ID:
        case XSValue::dt_IDREF:
        case XSValue::dt_IDREFS:
        case XSValue::dt_ENTITY:
        case XSValue::dt_ENTITIES:
            printf("ACTVALUE_TEST no Actual Value for datatype %s\n", StrX(getDataTypeString(datatype)).localForm());
            return false;

        case XSValue::dt_integer:
        case XSValue::dt_nonPositiveInteger:
        case XSValue::dt_negativeInteger:
        case XSValue::dt_long:
            if (actValue.fValue.f_long == expValue.fValue.f_long)
                return true;
            printf("ACTVALUE_TEST Unexpected %s XSValue, got %ld expected %ld\n", StrX(getDataTypeString(datatype)).localForm(),
                    actValue.fValue.f_long, expValue.fValue.f_long);
            return false;

        case XSValue::dt_int:
            if (actValue.fValue.f_int == expValue.fValue.f_int)
                return true;
            printf("ACTVALUE_TEST Unexpected dt_int XSValue, got %d expected %d\n",
                    actValue.fValue.f_int, expValue.fValue.f_int);
            return false;
        case XSValue::dt_short:
            if (actValue.fValue.f_short == expValue.fValue.f_short)
                return true;
            printf("ACTVALUE_TEST Unexpected dt_short XSValue, got %d expected %d\n",
                    actValue.fValue.f_short, expValue.fValue.f_short);
            return false;
        case XSValue::dt_byte:
            if (actValue.fValue.f_char == expValue.fValue.f_char)
                return true;
            printf("ACTVALUE_TEST Unexpected dt_byte XSValue, got %d expected %d\n",
                    actValue.fValue.f_char, expValue.fValue.f_char);
            return false;
        case XSValue::dt_nonNegativeInteger:
        case XSValue::dt_unsignedLong:
        case XSValue::dt_positiveInteger:
            if (actValue.fValue.f_ulong == expValue.fValue.f_ulong)
                return true;
            printf("ACTVALUE_TEST Unexpected %s XSValue, got %lu expected %lu\n", StrX(getDataTypeString(datatype)).localForm(),
                    actValue.fValue.f_ulong, expValue.fValue.f_ulong);
            return false;
        case XSValue::dt_unsignedInt:
            if (actValue.fValue.f_uint == expValue.fValue.f_uint)
                return true;
            printf("ACTVALUE_TEST Unexpected dt_unsignedIntXSValue, got %d expected %d\n",
                    actValue.fValue.f_uint, expValue.fValue.f_uint);
            return false;
        case XSValue::dt_unsignedShort:
            if (actValue.fValue.f_ushort == expValue.fValue.f_ushort)
                return true;
            printf("ACTVALUE_TEST Unexpected dt_unsignedShort XSValue, got %d expected %d\n",
                    actValue.fValue.f_ushort, expValue.fValue.f_ushort);
            return false;
        case XSValue::dt_unsignedByte:
            if (actValue.fValue.f_uchar == expValue.fValue.f_uchar)
                return true;
            printf("ACTVALUE_TEST Unexpected dt_unsignedByte XSValue, got %d expected %d\n",
                    actValue.fValue.f_uchar, expValue.fValue.f_uchar);
            return false;
        default:
            printf("ACTVALUE_TEST Unexpected datatype\n");
            return false;
    }
}